

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcsFile.cpp
# Opt level: O3

bool __thiscall mcsFile::ProcessNextLine(mcsFile *this,RecInfo *rec)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  ostream *poVar4;
  char cVar5;
  mcsFile *this_00;
  uchar *result;
  ulong uVar6;
  char *p2;
  uchar addr_high;
  uchar cksum;
  uchar addr_low;
  char buffer [64];
  uchar local_7b;
  uchar local_7a;
  uchar local_79;
  char local_78;
  char local_77 [2];
  char local_75 [2];
  char local_73 [2];
  char local_71 [2];
  char local_6f [63];
  
  std::ios::widen((char)*(undefined8 *)(*(long *)this + -0x18) + (char)this);
  this_00 = this;
  std::istream::getline((char *)this,(long)&local_78,'@');
  this->line_num = this->line_num + 1;
  if (((&this->field_0x20)[*(long *)(*(long *)this + -0x18)] & 2) != 0) {
    return false;
  }
  if (local_78 != ':') {
    return false;
  }
  iVar2 = *(int *)&this->field_0x8;
  if (iVar2 < 0x40) {
    bVar3 = toHex(this_00,local_77,&rec->ndata);
    if (!bVar3) {
      return false;
    }
    bVar1 = rec->ndata;
    if (bVar1 < 0x11) {
      bVar3 = toHex(this_00,local_75,&local_7b);
      if (!bVar3) {
        return false;
      }
      bVar3 = toHex(this_00,local_73,&local_79);
      if (!bVar3) {
        return false;
      }
      rec->addr = CONCAT11(local_7b,local_79);
      bVar3 = toHex(this_00,local_71,&rec->type);
      if (!bVar3) {
        return false;
      }
      cVar5 = local_7b + bVar1 + local_79 + rec->type;
      if (rec->ndata == '\0') {
        uVar6 = 0;
      }
      else {
        p2 = local_6f;
        result = rec->data;
        uVar6 = 0;
        do {
          bVar3 = toHex(this_00,p2,result);
          if (!bVar3) {
            return false;
          }
          cVar5 = cVar5 + *result;
          uVar6 = uVar6 + 1;
          result = result + 1;
          p2 = p2 + 2;
        } while (uVar6 < rec->ndata);
        uVar6 = (ulong)((uint)rec->ndata * 2);
      }
      bVar3 = toHex(this_00,local_6f + uVar6,&local_7a);
      if (!bVar3) {
        return false;
      }
      if ((uchar)(cVar5 + local_7a) != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"ProcessNextLine: line ",0x16);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->line_num);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," checksum error = ",0x12);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::endl<char,std::char_traits<char>>(poVar4);
        return false;
      }
      return true;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ProcessNextLine: line ",0x16);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->line_num);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," has too much data, num bytes = ",0x20);
    local_7b = rec->ndata;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_7b,1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ProcessNextLine: line ",0x16);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->line_num);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," has too many characters, nbytes = ",0x23);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar2);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return false;
}

Assistant:

bool mcsFile::ProcessNextLine(RecInfo &rec)
{
    // MCS file generated by ISE has line lengths no larger than 43 bytes
    const int MCS_LINE_MAX = 64;
    char buffer[MCS_LINE_MAX];

    file.getline(buffer, sizeof(buffer));
    line_num++;
    if (file.eof()) return false;

    if (buffer[0] != ':') return false;
    int nbytes = static_cast<int>(file.gcount());
    if (nbytes >= MCS_LINE_MAX) {
        // If this error occurs, increase MCS_LINE_MAX
        std::cerr << "ProcessNextLine: line " << line_num
                  << " has too many characters, nbytes = " << nbytes << std::endl;
        return false;
    }
    if (!buffer[nbytes-1]) nbytes--;

    unsigned long csum_computed = 0L;
    if (!toHex(buffer+1, rec.ndata)) return false;
    csum_computed += rec.ndata;
    if (rec.ndata > sizeof(rec.data)) {
        // If this error occurs, increase RecInfo::DATA_MAX
        std::cerr << "ProcessNextLine: line " << line_num
                  << " has too much data, num bytes = " << rec.ndata << std::endl;
        return false;
    }
    unsigned char addr_high, addr_low;
    if (!toHex(buffer+3, addr_high)) return false;
    csum_computed += addr_high;
    if (!toHex(buffer+5, addr_low)) return false;
    csum_computed += addr_low;
    rec.addr = (addr_high<<8)+addr_low;
    if (!toHex(buffer+7, rec.type)) return false;
    csum_computed += rec.type;

    // convert to binary and compute checksum
    for (unsigned int i = 0; i < rec.ndata; i++) {
        if (!toHex(buffer+9+2*i, rec.data[i])) return false;
        csum_computed += rec.data[i];
    }
    unsigned char cksum;
    if (!toHex(buffer+9+2*rec.ndata, cksum)) return false;
    csum_computed += cksum;
    
    csum_computed &= 0x000000ff;
    if (csum_computed) {
        std::cerr << "ProcessNextLine: line " << line_num
                  << " checksum error = " << csum_computed << std::endl;
        return false;
    }
    return true;
}